

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char **ppcVar2;
  char cVar3;
  lbool lVar4;
  int iVar5;
  vec<Minisat::Option_*,_int> *pvVar6;
  gzFile i;
  FILE *__s;
  long lVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  bool bVar13;
  rusage ru;
  BoolOption strictp;
  IntOption mem_lim;
  IntOption cpu_lim;
  IntOption verb;
  Solver S;
  int local_538;
  int local_534;
  double local_530;
  double local_528;
  Lit local_51c;
  vec<Minisat::Lit,_int> local_518;
  gzFile local_508;
  char **local_500;
  rusage local_4f8;
  Option local_468;
  char local_440;
  Option local_438;
  undefined8 local_410;
  int local_408;
  Option local_400;
  undefined8 local_3d8;
  uint32_t local_3d0;
  Option local_3c8;
  undefined8 local_3a0;
  int local_398;
  Solver local_390;
  
  local_538 = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  Minisat::setX86FPUPrecision();
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_3c8.name = "verb";
  local_3c8.description = "Verbosity level (0=silent, 1=some, 2=more).";
  local_3c8.category = "MAIN";
  local_3c8.type_name = "<int32>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_3c8;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00113c70;
  local_3a0 = 0x200000000;
  local_398 = 1;
  local_400._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_400.name = "cpu-lim";
  local_400.description = "Limit on CPU time allowed in seconds.\n";
  local_400.category = "MAIN";
  local_400.type_name = "<int32>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_400;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_400._vptr_Option = (_func_int **)&PTR__Option_00113c70;
  local_3d8 = 0x7fffffff00000000;
  local_3d0 = 0;
  local_438._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_438.name = "mem-lim";
  local_438.description = "Limit on memory usage in megabytes.\n";
  local_438.category = "MAIN";
  local_438.type_name = "<int32>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_438;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_438._vptr_Option = (_func_int **)&PTR__Option_00113c70;
  local_410 = 0x7fffffff00000000;
  local_408 = 0;
  local_468._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_468.name = "strict";
  local_468.description = "Validate DIMACS header during parsing.";
  local_468.category = "MAIN";
  local_468.type_name = "<bool>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_468;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_468._vptr_Option = (_func_int **)&PTR__Option_00113cf8;
  local_440 = '\0';
  Minisat::parseOptions(&local_538,argv,true);
  Minisat::Solver::Solver(&local_390);
  getrusage(RUSAGE_SELF,&local_4f8);
  local_528 = (double)local_4f8.ru_utime.tv_sec;
  local_530 = (double)local_4f8.ru_utime.tv_usec;
  local_390.verbosity = local_398;
  solver = &local_390;
  Minisat::sigTerm(SIGINT_exit);
  if (local_3d0 != 0) {
    Minisat::limitTime(local_3d0);
  }
  if ((long)local_408 != 0) {
    Minisat::limitMemory((long)local_408);
  }
  if ((local_538 == 1) &&
     (puts("Reading from standard input... Use \'--help\' for help."), local_538 == 1)) {
    i = (gzFile)gzdopen(0,"rb");
  }
  else {
    i = (gzFile)gzopen(argv[1],"rb");
  }
  if (i == (gzFile)0x0) {
    if (local_538 == 1) {
      pcVar12 = "<stdin>";
    }
    else {
      pcVar12 = argv[1];
    }
    printf("ERROR! Could not open file: %s\n",pcVar12);
    exit(1);
  }
  if (0 < local_390.verbosity) {
    puts("============================[ Problem Statistics ]=============================");
    puts("|                                                                             |");
  }
  cVar3 = local_440;
  Minisat::StreamBuffer::StreamBuffer((StreamBuffer *)&local_4f8,i);
  local_530 = local_530 / 1000000.0 + local_528;
  local_518.data = (Lit *)0x0;
  local_518.sz = 0;
  local_518.cap = 0;
  iVar9 = 0;
  local_534 = 0;
  local_508 = i;
  local_500 = argv;
LAB_00106218:
  do {
    Minisat::skipWhitespace<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
    if (local_4f8.ru_stime.tv_sec._4_4_ <= (int)local_4f8.ru_stime.tv_sec) {
      if ((cVar3 != '\0') && (iVar9 != local_534)) {
        puts("PARSE ERROR! DIMACS header mismatch: wrong number of clauses");
      }
      ppcVar2 = local_500;
      if (local_518.data != (Lit *)0x0) {
        local_518._8_8_ = local_518._8_8_ & 0xffffffff00000000;
        free(local_518.data);
      }
      free((void *)local_4f8.ru_utime.tv_usec);
      gzclose();
      if (local_538 < 3) {
        __s = (FILE *)0x0;
      }
      else {
        __s = fopen(ppcVar2[2],"wb");
      }
      if (0 < local_390.verbosity) {
        printf("|  Number of variables:  %12d                                         |\n",
               (ulong)(uint)local_390.next_var);
        printf("|  Number of clauses:    %12d                                         |\n",
               (ulong)(uint)local_390.num_clauses);
      }
      getrusage(RUSAGE_SELF,&local_4f8);
      if (0 < local_390.verbosity) {
        printf("|  Parse time:           %12.2f s                                       |\n",
               SUB84(((double)local_4f8.ru_utime.tv_sec +
                     (double)local_4f8.ru_utime.tv_usec / 1000000.0) - local_530,0));
        puts("|                                                                             |");
      }
      Minisat::sigTerm(SIGINT_interrupt);
      bVar13 = Minisat::Solver::simplify(&local_390);
      if (!bVar13) {
        if (__s != (FILE *)0x0) {
          fwrite("UNSAT\n",6,1,__s);
          fclose(__s);
        }
        if (0 < local_390.verbosity) {
          puts("===============================================================================");
          puts("Solved by unit propagation");
          Minisat::Solver::printStats(&local_390);
          putchar(10);
        }
        puts("UNSATISFIABLE");
        exit(0x14);
      }
      local_4f8.ru_utime.tv_sec = 0;
      local_4f8.ru_utime.tv_usec = 0;
      Minisat::vec<Minisat::Lit,_int>::copyTo
                ((vec<Minisat::Lit,_int> *)&local_4f8,&local_390.assumptions);
      lVar4 = Minisat::Solver::solve_(&local_390);
      if (0 < local_390.verbosity) {
        Minisat::Solver::printStats(&local_390);
        putchar(10);
      }
      if (lVar4.value == '\0') {
        puts("SATISFIABLE");
        iVar9 = 10;
        if (__s != (FILE *)0x0) {
          fwrite("SAT\n",4,1,__s);
          if (0 < local_390.next_var) {
            lVar7 = 0;
            uVar11 = local_390.next_var;
            do {
              if ((local_390.model.data[lVar7].value & 2) == 0) {
                pcVar12 = " ";
                if (lVar7 == 0) {
                  pcVar12 = "";
                }
                pcVar8 = "";
                if (local_390.model.data[lVar7].value != 0) {
                  pcVar8 = "-";
                }
                fprintf(__s,"%s%s%d",pcVar12,pcVar8,lVar7 + 1U & 0xffffffff);
                uVar11 = local_390.next_var;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)uVar11);
          }
          fwrite(" 0\n",3,1,__s);
          fclose(__s);
        }
      }
      else {
        pcVar12 = "INDETERMINATE\n";
        if (lVar4.value == '\x01') {
          pcVar12 = "UNSATISFIABLE\n";
        }
        printf(pcVar12);
        if (__s != (FILE *)0x0) {
          pcVar12 = "INDET\n";
          if (lVar4.value == '\x01') {
            pcVar12 = "UNSAT\n";
          }
          fwrite(pcVar12,6,1,__s);
          fclose(__s);
        }
        iVar9 = 0x14;
        if (lVar4.value != '\x01') {
          iVar9 = 0;
        }
      }
      if ((void *)local_4f8.ru_utime.tv_sec != (void *)0x0) {
        local_4f8.ru_utime.tv_usec = local_4f8.ru_utime.tv_usec & 0xffffffff00000000;
        free((void *)local_4f8.ru_utime.tv_sec);
      }
      Minisat::Solver::~Solver(&local_390);
      return iVar9;
    }
    if (*(char *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec) == 'p') {
      lVar7 = 1;
      bVar13 = false;
      cVar1 = 'p';
      iVar5 = local_4f8.ru_stime.tv_sec._4_4_;
      do {
        uVar11 = 0xffffffff;
        if ((int)local_4f8.ru_stime.tv_sec < iVar5) {
          uVar11 = (uint)*(byte *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec);
        }
        if (uVar11 != (int)cVar1) break;
        local_4f8.ru_stime.tv_sec._0_4_ = (int)local_4f8.ru_stime.tv_sec + 1;
        if (iVar5 <= (int)local_4f8.ru_stime.tv_sec) {
          local_4f8.ru_stime.tv_sec._0_4_ = 0;
          local_4f8.ru_stime.tv_sec._4_4_ =
               gzread(local_4f8.ru_utime.tv_sec,local_4f8.ru_utime.tv_usec,0x10000);
          iVar5 = local_4f8.ru_stime.tv_sec._4_4_;
        }
        cVar1 = "p cnf"[lVar7];
        bVar13 = cVar1 == '\0';
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      if (!bVar13) {
        uVar10 = 0xffffffff;
        if ((int)local_4f8.ru_stime.tv_sec < iVar5) {
          uVar10 = (ulong)*(byte *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec);
        }
        printf("PARSE ERROR! Unexpected char: %c\n",uVar10);
        exit(3);
      }
      Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      local_534 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      goto LAB_00106218;
    }
    iVar5 = local_4f8.ru_stime.tv_sec._4_4_;
    if (*(char *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec) == 'c') {
      do {
        lVar7 = (long)(int)local_4f8.ru_stime.tv_sec;
        local_4f8.ru_stime.tv_sec._0_4_ = (int)local_4f8.ru_stime.tv_sec + 1;
        if (*(char *)(local_4f8.ru_utime.tv_usec + lVar7) == '\n') {
          if (iVar5 <= (int)local_4f8.ru_stime.tv_sec) {
            local_4f8.ru_stime.tv_sec._0_4_ = 0;
            local_4f8.ru_stime.tv_sec._4_4_ =
                 gzread(local_4f8.ru_utime.tv_sec,local_4f8.ru_utime.tv_usec,0x10000);
          }
          break;
        }
        if (iVar5 <= (int)local_4f8.ru_stime.tv_sec) {
          local_4f8.ru_stime.tv_sec._0_4_ = 0;
          local_4f8.ru_stime.tv_sec._4_4_ =
               gzread(local_4f8.ru_utime.tv_sec,local_4f8.ru_utime.tv_usec,0x10000);
          iVar5 = local_4f8.ru_stime.tv_sec._4_4_;
        }
      } while ((int)local_4f8.ru_stime.tv_sec < iVar5);
    }
    else {
      if (local_518.data != (Lit *)0x0) {
        local_518._8_8_ = local_518._8_8_ & 0xffffffff00000000;
      }
      iVar5 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      local_528 = (double)CONCAT44(local_528._4_4_,iVar9);
      while (iVar5 != 0) {
        iVar9 = -iVar5;
        if (0 < iVar5) {
          iVar9 = iVar5;
        }
        while (local_390.next_var < iVar9) {
          Minisat::Solver::newVar(&local_390,(lbool)0x2,true);
        }
        local_51c.x = ((iVar5 < 1) - 2) + iVar9 * 2;
        Minisat::vec<Minisat::Lit,_int>::push(&local_518,&local_51c);
        iVar5 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      }
      iVar9 = local_528._0_4_ + 1;
      Minisat::Solver::addClause_(&local_390,&local_518);
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n");
        setX86FPUPrecision();

        // Extra options:
        //
        IntOption    verb   ("MAIN", "verb",   "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 2));
        IntOption    cpu_lim("MAIN", "cpu-lim","Limit on CPU time allowed in seconds.\n", 0, IntRange(0, INT32_MAX));
        IntOption    mem_lim("MAIN", "mem-lim","Limit on memory usage in megabytes.\n", 0, IntRange(0, INT32_MAX));
        BoolOption   strictp("MAIN", "strict", "Validate DIMACS header during parsing.", false);
        
        parseOptions(argc, argv, true);

        Solver S;
        double initial_time = cpuTime();

        S.verbosity = verb;
        
        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        sigTerm(SIGINT_exit);

        // Try to set resource limits:
        if (cpu_lim != 0) limitTime(cpu_lim);
        if (mem_lim != 0) limitMemory(mem_lim);
        
        if (argc == 1)
            printf("Reading from standard input... Use '--help' for help.\n");
        
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
        if (in == NULL)
            printf("ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);
        
        if (S.verbosity > 0){
            printf("============================[ Problem Statistics ]=============================\n");
            printf("|                                                                             |\n"); }
        
        parse_DIMACS(in, S, (bool)strictp);
        gzclose(in);
        FILE* res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;
        
        if (S.verbosity > 0){
            printf("|  Number of variables:  %12d                                         |\n", S.nVars());
            printf("|  Number of clauses:    %12d                                         |\n", S.nClauses()); }
        
        double parsed_time = cpuTime();
        if (S.verbosity > 0){
            printf("|  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);
            printf("|                                                                             |\n"); }
 
        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        sigTerm(SIGINT_interrupt);
       
        if (!S.simplify()){
            if (res != NULL) fprintf(res, "UNSAT\n"), fclose(res);
            if (S.verbosity > 0){
                printf("===============================================================================\n");
                printf("Solved by unit propagation\n");
                S.printStats();
                printf("\n"); }
            printf("UNSATISFIABLE\n");
            exit(20);
        }
        
        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);
        if (S.verbosity > 0){
            S.printStats();
            printf("\n"); }
        printf(ret == l_True ? "SATISFIABLE\n" : ret == l_False ? "UNSATISFIABLE\n" : "INDETERMINATE\n");
        if (res != NULL){
            if (ret == l_True){
                fprintf(res, "SAT\n");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i==0)?"":" ", (S.model[i]==l_True)?"":"-", i+1);
                fprintf(res, " 0\n");
            }else if (ret == l_False)
                fprintf(res, "UNSAT\n");
            else
                fprintf(res, "INDET\n");
            fclose(res);
        }
        
#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0);     // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException&){
        printf("===============================================================================\n");
        printf("INDETERMINATE\n");
        exit(0);
    }
}